

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::InsertInstr(IRBuilder *this,Instr *instr,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  
  uVar3 = IR::Instr::GetByteCodeOffset(insertBeforeInstr);
  if (this->m_offsetToInstructionCount <= uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x432,
                       "(insertBeforeInstr->GetByteCodeOffset() < m_offsetToInstructionCount)",
                       "insertBeforeInstr->GetByteCodeOffset() < m_offsetToInstructionCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  IR::Instr::SetByteCodeOffset(instr,insertBeforeInstr);
  uVar3 = IR::Instr::GetByteCodeOffset(insertBeforeInstr);
  if (this->m_offsetToInstruction[uVar3] == insertBeforeInstr) {
    this->m_offsetToInstruction[uVar3] = instr;
  }
  IR::Instr::InsertBefore(insertBeforeInstr,instr);
  sourceContextId = Func::GetSourceContextId(this->m_func->topFunc);
  functionId = Func::GetLocalFunctionId(this->m_func->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,IRBuilderPhase,sourceContextId,functionId);
  if (bVar2) {
    IR::Instr::Dump(instr);
    return;
  }
  return;
}

Assistant:

void IRBuilder::InsertInstr(IR::Instr *instr, IR::Instr* insertBeforeInstr)
{
    AssertOrFailFast(insertBeforeInstr->GetByteCodeOffset() < m_offsetToInstructionCount);
    instr->SetByteCodeOffset(insertBeforeInstr);
    uint32 offset = insertBeforeInstr->GetByteCodeOffset();
    if (m_offsetToInstruction[offset] == insertBeforeInstr)
    {
        m_offsetToInstruction[offset] = instr;
    }
    insertBeforeInstr->InsertBefore(instr);

#if DBG_DUMP
    if (PHASE_TRACE(Js::IRBuilderPhase, m_func->GetTopFunc()))
    {
        instr->Dump();
    }
#endif
}